

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddPriority.c
# Opt level: O2

int Cudd_MinHammingDist(DdManager *dd,DdNode *f,int *minterm,int upperBound)

{
  int iVar1;
  DdHashTable *table;
  double ep;
  
  table = cuddHashTableInit(dd,1,2);
  if (table == (DdHashTable *)0x0) {
    iVar1 = -1;
  }
  else {
    ep = Cudd_ReadEpsilon(dd);
    Cudd_SetEpsilon(dd,0.0);
    iVar1 = cuddMinHammingDistRecur(f,minterm,table,upperBound);
    cuddHashTableQuit(table);
    Cudd_SetEpsilon(dd,ep);
  }
  return iVar1;
}

Assistant:

int
Cudd_MinHammingDist(
  DdManager *dd /* DD manager */,
  DdNode *f /* function to examine */,
  int *minterm /* reference minterm */,
  int upperBound /* distance above which an approximate answer is OK */)
{
    DdHashTable *table;
    CUDD_VALUE_TYPE epsilon;
    int res;

    table = cuddHashTableInit(dd,1,2);
    if (table == NULL) {
        return(CUDD_OUT_OF_MEM);
    }
    epsilon = Cudd_ReadEpsilon(dd);
    Cudd_SetEpsilon(dd,(CUDD_VALUE_TYPE)0.0);
    res = cuddMinHammingDistRecur(f,minterm,table,upperBound);
    cuddHashTableQuit(table);
    Cudd_SetEpsilon(dd,epsilon);

    return(res);

}